

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int parse_uncompressed_block(zbuf *a)

{
  int iVar1;
  uint n;
  int local_28;
  int k;
  int nlen;
  int len;
  uint8 header [4];
  zbuf *a_local;
  
  _len = a;
  if ((a->num_bits & 7U) != 0) {
    zreceive(a,a->num_bits & 7);
  }
  local_28 = 0;
  while (0 < _len->num_bits) {
    *(char *)((long)&nlen + (long)local_28) = (char)_len->code_buffer;
    _len->code_buffer = _len->code_buffer >> 8;
    _len->num_bits = _len->num_bits + -8;
    local_28 = local_28 + 1;
  }
  if (_len->num_bits == 0) {
    while (local_28 < 4) {
      iVar1 = zget8(_len);
      *(char *)((long)&nlen + (long)local_28) = (char)iVar1;
      local_28 = local_28 + 1;
    }
    n = (uint)nlen._1_1_ * 0x100 + (uint)(byte)nlen;
    if ((uint)nlen._3_1_ * 0x100 + (uint)nlen._2_1_ == (n ^ 0xffff)) {
      if (_len->zbuffer_end < _len->zbuffer + (int)n) {
        a_local._4_4_ = e("Corrupt PNG");
      }
      else if ((_len->zout_end < _len->zout + (int)n) && (iVar1 = expand(_len,n), iVar1 == 0)) {
        a_local._4_4_ = 0;
      }
      else {
        memcpy(_len->zout,_len->zbuffer,(long)(int)n);
        _len->zbuffer = _len->zbuffer + (int)n;
        _len->zout = _len->zout + (int)n;
        a_local._4_4_ = 1;
      }
    }
    else {
      a_local._4_4_ = e("Corrupt PNG");
    }
    return a_local._4_4_;
  }
  __assert_fail("a->num_bits == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                ,0x752,"int parse_uncompressed_block(zbuf *)");
}

Assistant:

static int parse_uncompressed_block(zbuf *a)
{
   uint8 header[4];
   int len,nlen,k;
   if (a->num_bits & 7)
      zreceive(a, a->num_bits & 7); // discard
   // drain the bit-packed data into header
   k = 0;
   while (a->num_bits > 0) {
      header[k++] = (uint8) (a->code_buffer & 255); // wtf this warns?
      a->code_buffer >>= 8;
      a->num_bits -= 8;
   }
   assert(a->num_bits == 0);
   // now fill header the normal way
   while (k < 4)
      header[k++] = (uint8) zget8(a);
   len  = header[1] * 256 + header[0];
   nlen = header[3] * 256 + header[2];
   if (nlen != (len ^ 0xffff)) return e("zlib corrupt","Corrupt PNG");
   if (a->zbuffer + len > a->zbuffer_end) return e("read past buffer","Corrupt PNG");
   if (a->zout + len > a->zout_end)
      if (!expand(a, len)) return 0;
   memcpy(a->zout, a->zbuffer, len);
   a->zbuffer += len;
   a->zout += len;
   return 1;
}